

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseInternalSubset(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  bool bVar4;
  uint cons;
  xmlChar *check;
  int baseInputNr;
  xmlParserCtxtPtr ctxt_local;
  
  if (*ctxt->input->cur == '[') {
    iVar1 = ctxt->inputNr;
    ctxt->instate = XML_PARSER_DTD;
    ctxt->curly = 1;
    xmlNextChar(ctxt);
    while( true ) {
      if ((*ctxt->input->cur != ']') || (bVar4 = false, iVar1 < ctxt->inputNr)) {
        bVar4 = ctxt->instate != XML_PARSER_EOF;
      }
      if (!bVar4) break;
      pxVar2 = ctxt->input->cur;
      uVar3 = ctxt->input->consumed;
      xmlSkipBlankChars(ctxt);
      xmlParseMarkupDecl(ctxt);
      xmlParsePEReference(ctxt);
      if ((((1 < ctxt->inputNr) && (ctxt->input->filename != (char *)0x0)) &&
          (*ctxt->input->cur == '<')) &&
         ((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '[')))) {
        xmlParseConditionalSections(ctxt);
      }
      if ((ctxt->input->cur == pxVar2) && ((uVar3 & 0xffffffff) == ctxt->input->consumed)) {
        xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,
                    "xmlParseInternalSubset: error detected in Markup declaration\n");
        if (ctxt->inputNr <= iVar1) break;
        xmlPopInput(ctxt);
      }
    }
    if (*ctxt->input->cur == ']') {
      ctxt->curly = 0;
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
    }
  }
  if (((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '>')) ||
     ((ctxt->mlType == XML_TYPE_SML && ((*ctxt->input->cur == '\n' || (*ctxt->input->cur == ';')))))
     ) {
    xmlNextChar(ctxt);
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
  }
  return;
}

Assistant:

static void
xmlParseInternalSubset(xmlParserCtxtPtr ctxt) {

    DEBUG_ENTER(("xmlParseInternalSubset(%s);\n", dbgCtxt(ctxt)));

    /*
     * Is there any DTD definition ?
     */
    if (RAW == '[') {
        int baseInputNr = ctxt->inputNr;
        ctxt->instate = XML_PARSER_DTD;
        ctxt->curly = 1;
        NEXT;
	/*
	 * Parse the succession of Markup declarations and
	 * PEReferences.
	 * Subsequence (markupdecl | PEReference | S)*
	 */
	while (((RAW != ']') || (ctxt->inputNr > baseInputNr)) &&
               (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *check = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;

	    SKIP_BLANKS;
	    xmlParseMarkupDecl(ctxt);
	    xmlParsePEReference(ctxt);

            /*
             * Conditional sections are allowed from external entities included
             * by PE References in the internal subset.
             */
            if ((ctxt->inputNr > 1) && (ctxt->input->filename != NULL) &&
                (RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                xmlParseConditionalSections(ctxt);
            }

	    if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	     "xmlParseInternalSubset: error detected in Markup declaration\n");
                if (ctxt->inputNr > baseInputNr)
                    xmlPopInput(ctxt);
                else
		    break;
	    }
	}
	if (RAW == ']') {
	    ctxt->curly = 0;
	    NEXT;
	    SKIP_BLANKS;
	}
    }

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (!RAW_IS_GT_MLI) { /* RAW != '>' */
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
	RETURN();
    }
    NEXT;
    RETURN();
}